

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

IOFileUD * io_file_new(lua_State *L)

{
  IOFileUD *pIVar1;
  ulong uVar2;
  GCudata *ud;
  IOFileUD *iof;
  lua_State *L_local;
  
  pIVar1 = (IOFileUD *)lua_newuserdata(L,0x10);
  uVar2 = L->top[-1].u64 & 0x7fffffffffff;
  *(undefined1 *)(uVar2 + 10) = 1;
  *(undefined8 *)(uVar2 + 0x20) = *(undefined8 *)((L->base[-2].u64 & 0x7fffffffffff) + 0x10);
  pIVar1->fp = (FILE *)0x0;
  pIVar1->type = 0;
  return pIVar1;
}

Assistant:

static IOFileUD *io_file_new(lua_State *L)
{
  IOFileUD *iof = (IOFileUD *)lua_newuserdata(L, sizeof(IOFileUD));
  GCudata *ud = udataV(L->top-1);
  ud->udtype = UDTYPE_IO_FILE;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcrefr(ud->metatable, curr_func(L)->c.env);
  iof->fp = NULL;
  iof->type = IOFILE_TYPE_FILE;
  return iof;
}